

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O3

void initErrorLine(void)

{
  int iVar1;
  int iVar2;
  pointer pTVar3;
  
  ErrorLine[0] = '\0';
  ErrorLine2[0] = '\0';
  if ((0xfffffffc < pass - 4U) &&
     (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    snprintf(ErrorLine,0x1000,"%s(%d): ",
             sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].filename,
             (ulong)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].line);
    iVar2 = 0;
    if (0 < IncludeLevel) {
      iVar2 = IncludeLevel;
    }
    iVar1 = (int)((ulong)((long)sourcePosStack.
                                super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)sourcePosStack.
                               super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    if (SBORROW4(iVar2 + 1,iVar1 * -0x55555555) != iVar2 + 1 + iVar1 * 0x55555555 < 0) {
      pTVar3 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish + -3;
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish + -2 ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ||
          (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-2].line != skipEmitMessagePos.line ||
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish[-2].filename != skipEmitMessagePos.filename)) {
        pTVar3 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -2;
      }
      if ((pTVar3->line != skipEmitMessagePos.line ||
           pTVar3->filename != skipEmitMessagePos.filename) &&
         ((pTVar3->filename !=
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].filename ||
          (pTVar3->line !=
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].line)))) {
        snprintf(ErrorLine2,0x1000,"%s(%d): ^ emitted from here\n");
        return;
      }
    }
  }
  return;
}

Assistant:

static void initErrorLine() {		// adds filename + line of definition if possible
	*ErrorLine = 0;
	*ErrorLine2 = 0;
	// when OpenFile is reporting error, the filename is still nullptr, but pass==1 already
	if (pass < 1 || LASTPASS < pass || sourcePosStack.empty()) return;
	SPRINTF2(ErrorLine, LINEMAX2, "%s(%d): ", sourcePosStack.back().filename, sourcePosStack.back().line);
	// if the error filename:line is not identical with current source line, add ErrorLine2 about emit
	if (std::max(1, aint(IncludeLevel + 1)) < aint(sourcePosStack.size())) {
		auto previous = sourcePosStack.end() - 2;
		if (*previous == skipEmitMessagePos && previous != sourcePosStack.begin()) --previous;
		if (*previous != skipEmitMessagePos && *previous != sourcePosStack.back()) {
			SPRINTF2(ErrorLine2, LINEMAX2, "%s(%d): ^ emitted from here\n", previous->filename, previous->line);
		}
	}
}